

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

int nn_req_getopt(nn_sockbase *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  
  if (option == 1 && level == 0x30) {
    if (3 < *optvallen) {
      *(undefined4 *)optval = *(undefined4 *)&self[0x38].vfptr;
      *optvallen = 4;
      return 0;
    }
    iVar1 = -0x16;
  }
  else {
    iVar1 = -0x5c;
  }
  return iVar1;
}

Assistant:

int nn_req_getopt (struct nn_sockbase *self, int level, int option,
        void *optval, size_t *optvallen)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    if (level != NN_REQ)
        return -ENOPROTOOPT;

    if (option == NN_REQ_RESEND_IVL) {
        if (nn_slow (*optvallen < sizeof (int)))
            return -EINVAL;
        *(int*) optval = req->resend_ivl;
        *optvallen = sizeof (int);
        return 0;
    }

    return -ENOPROTOOPT;
}